

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_snd_static.cxx
# Opt level: O3

void __thiscall
write_sound_src::operator()(write_sound_src *this,sound_src_data *sound_src,xr_writer *w)

{
  float local_1c;
  
  xray_re::xr_writer::open_chunk(w,0);
  xray_re::xr_writer::w_sz(w,&sound_src->name);
  local_1c = (sound_src->position).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (sound_src->position).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (sound_src->position).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = sound_src->volume;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = sound_src->freq;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)(sound_src->active_time).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)(sound_src->active_time).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)(sound_src->play_time).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)(sound_src->play_time).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)(sound_src->pause_time).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)(sound_src->pause_time).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  return;
}

Assistant:

void operator()(const sound_src_data* sound_src, xr_writer& w) const {
	w.open_chunk(0);
	w.w_sz(sound_src->name);
	w.w_fvector3(sound_src->position);
	w.w_float(sound_src->volume);
	w.w_float(sound_src->freq);
	w.w_i32vector2(sound_src->active_time);
	w.w_i32vector2(sound_src->play_time);
	w.w_i32vector2(sound_src->pause_time);
}